

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# types_wrapper.h
# Opt level: O2

void __thiscall
Am_Value_List_Data::Make_Unique
          (Am_Value_List_Data *this,Am_Value_List_Data **data,Am_List_Item **current)

{
  Am_List_Item *pAVar1;
  int iVar2;
  undefined4 extraout_var;
  Am_List_Item *pAVar3;
  Am_List_Item **ppAVar4;
  
  if ((this->super_Am_Wrapper).refs != 1) {
    iVar2 = (*((*data)->super_Am_Wrapper).super_Am_Registered_Type._vptr_Am_Registered_Type[5])();
    pAVar3 = *current;
    if (pAVar3 != (Am_List_Item *)0x0) {
      ppAVar4 = &((Am_Value_List_Data *)CONCAT44(extraout_var,iVar2))->head;
      do {
        pAVar3 = pAVar3->prev;
        pAVar1 = *ppAVar4;
        ppAVar4 = &pAVar1->next;
      } while (pAVar3 != (Am_List_Item *)0x0);
      *current = pAVar1;
    }
    *data = (Am_Value_List_Data *)CONCAT44(extraout_var,iVar2);
  }
  return;
}

Assistant:

bool Is_Unique() { return (refs == 1); }